

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int rsa_check_context(mbedtls_rsa_context *ctx,int is_priv,int blinding_needed)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  mbedtls_mpi *pmVar5;
  
  sVar1 = ctx->len;
  pmVar5 = &ctx->N;
  sVar3 = mbedtls_mpi_size(pmVar5);
  iVar4 = -0x4080;
  if ((((sVar1 == sVar3) && (ctx->len < 0x401)) &&
      (iVar2 = mbedtls_mpi_cmp_int(pmVar5,0), 0 < iVar2)) &&
     (iVar2 = mbedtls_mpi_get_bit(pmVar5,0), iVar2 != 0)) {
    if (is_priv == 0) {
      pmVar5 = &ctx->E;
    }
    else {
      iVar2 = mbedtls_mpi_cmp_int(&ctx->P,0);
      if (iVar2 < 1) {
        return -0x4080;
      }
      iVar2 = mbedtls_mpi_get_bit(&ctx->P,0);
      if (iVar2 == 0) {
        return -0x4080;
      }
      iVar2 = mbedtls_mpi_cmp_int(&ctx->Q,0);
      if (iVar2 < 1) {
        return -0x4080;
      }
      iVar2 = mbedtls_mpi_get_bit(&ctx->Q,0);
      if (iVar2 == 0) {
        return -0x4080;
      }
      iVar2 = mbedtls_mpi_cmp_int(&ctx->E,0);
      if (iVar2 < 1) {
        return -0x4080;
      }
      iVar2 = mbedtls_mpi_cmp_int(&ctx->DP,0);
      if (iVar2 < 1) {
        return -0x4080;
      }
      iVar2 = mbedtls_mpi_cmp_int(&ctx->DQ,0);
      if (iVar2 < 1) {
        return -0x4080;
      }
      pmVar5 = &ctx->QP;
    }
    iVar2 = mbedtls_mpi_cmp_int(pmVar5,0);
    if (0 < iVar2) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int rsa_check_context( mbedtls_rsa_context const *ctx, int is_priv,
                              int blinding_needed )
{
#if !defined(MBEDTLS_RSA_NO_CRT)
    /* blinding_needed is only used for NO_CRT to decide whether
     * P,Q need to be present or not. */
    ((void) blinding_needed);
#endif

    if( ctx->len != mbedtls_mpi_size( &ctx->N ) ||
        ctx->len > MBEDTLS_MPI_MAX_SIZE )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }

    /*
     * 1. Modular exponentiation needs positive, odd moduli.
     */

    /* Modular exponentiation wrt. N is always used for
     * RSA public key operations. */
    if( mbedtls_mpi_cmp_int( &ctx->N, 0 ) <= 0 ||
        mbedtls_mpi_get_bit( &ctx->N, 0 ) == 0  )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Modular exponentiation for P and Q is only
     * used for private key operations and if CRT
     * is used. */
    if( is_priv &&
        ( mbedtls_mpi_cmp_int( &ctx->P, 0 ) <= 0 ||
          mbedtls_mpi_get_bit( &ctx->P, 0 ) == 0 ||
          mbedtls_mpi_cmp_int( &ctx->Q, 0 ) <= 0 ||
          mbedtls_mpi_get_bit( &ctx->Q, 0 ) == 0  ) )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }
#endif /* !MBEDTLS_RSA_NO_CRT */

    /*
     * 2. Exponents must be positive
     */

    /* Always need E for public key operations */
    if( mbedtls_mpi_cmp_int( &ctx->E, 0 ) <= 0 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

#if defined(MBEDTLS_RSA_NO_CRT)
    /* For private key operations, use D or DP & DQ
     * as (unblinded) exponents. */
    if( is_priv && mbedtls_mpi_cmp_int( &ctx->D, 0 ) <= 0 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
#else
    if( is_priv &&
        ( mbedtls_mpi_cmp_int( &ctx->DP, 0 ) <= 0 ||
          mbedtls_mpi_cmp_int( &ctx->DQ, 0 ) <= 0  ) )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Blinding shouldn't make exponents negative either,
     * so check that P, Q >= 1 if that hasn't yet been
     * done as part of 1. */
#if defined(MBEDTLS_RSA_NO_CRT)
    if( is_priv && blinding_needed &&
        ( mbedtls_mpi_cmp_int( &ctx->P, 0 ) <= 0 ||
          mbedtls_mpi_cmp_int( &ctx->Q, 0 ) <= 0 ) )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }
#endif

    /* It wouldn't lead to an error if it wasn't satisfied,
     * but check for QP >= 1 nonetheless. */
#if !defined(MBEDTLS_RSA_NO_CRT)
    if( is_priv &&
        mbedtls_mpi_cmp_int( &ctx->QP, 0 ) <= 0 )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }
#endif

    return( 0 );
}